

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O3

void __thiscall sftm::CAsyncTaskManager::Stop(CAsyncTaskManager *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  timespec local_38;
  
  uVar1 = this->m_nWorkerCount;
  uVar3 = (ulong)uVar1;
  if (uVar3 != 0) {
    lVar5 = 0;
    do {
      (&(this->m_workers)._M_elems[0].m_bStopping)[lVar5] = true;
      lVar5 = lVar5 + 0x20;
    } while (uVar3 << 5 != lVar5);
    if (uVar1 != 0) {
      uVar6 = 0;
      do {
        if ((this->m_workers)._M_elems[uVar6].m_bFinished == false) {
          do {
            local_38.tv_sec = 0;
            local_38.tv_nsec = 10000000;
            do {
              iVar2 = nanosleep(&local_38,&local_38);
              if (iVar2 != -1) break;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
            std::condition_variable::notify_all();
          } while ((this->m_workers)._M_elems[uVar6].m_bFinished != true);
          uVar3 = (ulong)this->m_nWorkerCount;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar3);
    }
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}